

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

void __thiscall Assimp::FBXExporter::WriteConnections(FBXExporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pNVar2;
  Node *n;
  pointer this_00;
  StreamWriterLE outstream;
  Node conn;
  shared_ptr<Assimp::IOStream> local_e0;
  undefined1 local_d0 [16];
  element_type local_c0 [5];
  Node local_98;
  
  if (this->binary == false) {
    paVar1 = &local_98.name.field_2;
    local_98.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Object connections","");
    WriteAsciiSectionHeader(this,&local_98.name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  local_d0._0_8_ = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Connections","");
  paVar1 = &local_98.name.field_2;
  local_98.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_d0._0_8_,
             (long)(_func_int ***)local_d0._0_8_ + (long)(_func_int ***)local_d0._8_8_);
  local_98.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.force_has_children = false;
  if ((element_type *)local_d0._0_8_ != local_c0) {
    operator_delete((void *)local_d0._0_8_,(long)local_c0[0]._vptr_IOStream + 1);
  }
  local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  StreamWriter<false,_false>::StreamWriter((StreamWriter<false,_false> *)local_d0,&local_e0,false);
  if (local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  FBX::Node::Begin(&local_98,(StreamWriterLE *)local_d0,this->binary,0);
  FBX::Node::BeginChildren(&local_98,(StreamWriterLE *)local_d0,this->binary,0);
  this_00 = (this->connections).
            super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar2 = (this->connections).
           super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pNVar2) {
    do {
      FBX::Node::Dump(this_00,(StreamWriterLE *)local_d0,this->binary,1);
      this_00 = this_00 + 1;
    } while (this_00 != pNVar2);
  }
  FBX::Node::End(&local_98,(StreamWriterLE *)local_d0,this->binary,0,
                 (this->connections).
                 super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 (this->connections).
                 super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::_M_erase_at_end
            (&this->connections,
             (this->connections).
             super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  StreamWriter<false,_false>::~StreamWriter((StreamWriter<false,_false> *)local_d0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_98.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_98.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBXExporter::WriteConnections ()
{
    // we should have completed the connection graph already,
    // so basically just dump it here
    if (!binary) {
        WriteAsciiSectionHeader("Object connections");
    }
    // TODO: comments with names in the ascii version
    FBX::Node conn("Connections");
    StreamWriterLE outstream(outfile);
    conn.Begin(outstream, binary, 0);
    conn.BeginChildren(outstream, binary, 0);
    for (auto &n : connections) {
        n.Dump(outstream, binary, 1);
    }
    conn.End(outstream, binary, 0, !connections.empty());
    connections.clear();
}